

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::GenerateTargetInstallRules
          (cmLocalGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurationTypes)

{
  size_type *psVar1;
  pointer ppcVar2;
  cmGeneratorTarget *this_00;
  TargetType TVar3;
  char *pcVar4;
  string *psVar5;
  pointer ppcVar6;
  string destination;
  cmInstallScriptGenerator g;
  string local_168;
  cmInstallTargetGenerator local_148;
  
  ppcVar6 = (this->GeneratorTargets).
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar2 = (this->GeneratorTargets).
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppcVar6 != ppcVar2) {
    psVar1 = &local_148.super_cmInstallGenerator.super_cmScriptGenerator.RuntimeConfigVariable.
              _M_string_length;
    do {
      this_00 = *ppcVar6;
      TVar3 = cmGeneratorTarget::GetType(this_00);
      if (TVar3 != INTERFACE_LIBRARY) {
        local_148.super_cmInstallGenerator.super_cmScriptGenerator._vptr_cmScriptGenerator =
             (_func_int **)psVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_148,"PRE_INSTALL_SCRIPT","");
        pcVar4 = cmGeneratorTarget::GetProperty(this_00,(string *)&local_148);
        if (local_148.super_cmInstallGenerator.super_cmScriptGenerator._vptr_cmScriptGenerator !=
            (_func_int **)psVar1) {
          operator_delete(local_148.super_cmInstallGenerator.super_cmScriptGenerator.
                          _vptr_cmScriptGenerator,
                          local_148.super_cmInstallGenerator.super_cmScriptGenerator.
                          RuntimeConfigVariable._M_string_length + 1);
        }
        if (pcVar4 != (char *)0x0) {
          cmInstallScriptGenerator::cmInstallScriptGenerator
                    ((cmInstallScriptGenerator *)&local_148,pcVar4,false,(char *)0x0,false);
          cmScriptGenerator::Generate((cmScriptGenerator *)&local_148,os,config,configurationTypes);
          cmInstallScriptGenerator::~cmInstallScriptGenerator
                    ((cmInstallScriptGenerator *)&local_148);
        }
        psVar5 = cmTarget::GetInstallPath_abi_cxx11_(this_00->Target);
        if (psVar5->_M_string_length != 0) {
          psVar5 = cmTarget::GetInstallPath_abi_cxx11_(this_00->Target);
          std::__cxx11::string::substr((ulong)&local_168,(ulong)psVar5);
          cmsys::SystemTools::ConvertToUnixSlashes(&local_168);
          if (local_168._M_string_length == 0) {
            std::__cxx11::string::_M_replace((ulong)&local_168,0,(char *)0x0,0x4f983f);
          }
          TVar3 = cmGeneratorTarget::GetType(this_00);
          if (TVar3 < SHARED_LIBRARY) {
LAB_002deefe:
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
            cmInstallTargetGeneratorLocal::cmInstallTargetGeneratorLocal
                      ((cmInstallTargetGeneratorLocal *)&local_148,this,psVar5,
                       local_168._M_dataplus._M_p,false);
            cmScriptGenerator::Generate
                      ((cmScriptGenerator *)&local_148,os,config,configurationTypes);
LAB_002def6c:
            cmInstallTargetGenerator::~cmInstallTargetGenerator(&local_148);
          }
          else {
            if (TVar3 == SHARED_LIBRARY) {
              psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
              cmInstallTargetGeneratorLocal::cmInstallTargetGeneratorLocal
                        ((cmInstallTargetGeneratorLocal *)&local_148,this,psVar5,
                         local_168._M_dataplus._M_p,false);
              cmScriptGenerator::Generate
                        ((cmScriptGenerator *)&local_148,os,config,configurationTypes);
              goto LAB_002def6c;
            }
            if (TVar3 == MODULE_LIBRARY) goto LAB_002deefe;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          }
        }
        local_148.super_cmInstallGenerator.super_cmScriptGenerator._vptr_cmScriptGenerator =
             (_func_int **)psVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_148,"POST_INSTALL_SCRIPT","");
        pcVar4 = cmGeneratorTarget::GetProperty(this_00,(string *)&local_148);
        if (local_148.super_cmInstallGenerator.super_cmScriptGenerator._vptr_cmScriptGenerator !=
            (_func_int **)psVar1) {
          operator_delete(local_148.super_cmInstallGenerator.super_cmScriptGenerator.
                          _vptr_cmScriptGenerator,
                          local_148.super_cmInstallGenerator.super_cmScriptGenerator.
                          RuntimeConfigVariable._M_string_length + 1);
        }
        if (pcVar4 != (char *)0x0) {
          cmInstallScriptGenerator::cmInstallScriptGenerator
                    ((cmInstallScriptGenerator *)&local_148,pcVar4,false,(char *)0x0,false);
          cmScriptGenerator::Generate((cmScriptGenerator *)&local_148,os,config,configurationTypes);
          cmInstallScriptGenerator::~cmInstallScriptGenerator
                    ((cmInstallScriptGenerator *)&local_148);
        }
      }
      ppcVar6 = ppcVar6 + 1;
    } while (ppcVar6 != ppcVar2);
  }
  return;
}

Assistant:

void cmLocalGenerator::GenerateTargetInstallRules(
  std::ostream& os, const std::string& config,
  std::vector<std::string> const& configurationTypes)
{
  // Convert the old-style install specification from each target to
  // an install generator and run it.
  const std::vector<cmGeneratorTarget*>& tgts = this->GetGeneratorTargets();
  for (cmGeneratorTarget* l : tgts) {
    if (l->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }

    // Include the user-specified pre-install script for this target.
    if (const char* preinstall = l->GetProperty("PRE_INSTALL_SCRIPT")) {
      cmInstallScriptGenerator g(preinstall, false, nullptr, false);
      g.Generate(os, config, configurationTypes);
    }

    // Install this target if a destination is given.
    if (!l->Target->GetInstallPath().empty()) {
      // Compute the full install destination.  Note that converting
      // to unix slashes also removes any trailing slash.
      // We also skip over the leading slash given by the user.
      std::string destination = l->Target->GetInstallPath().substr(1);
      cmSystemTools::ConvertToUnixSlashes(destination);
      if (destination.empty()) {
        destination = ".";
      }

      // Generate the proper install generator for this target type.
      switch (l->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY: {
          // Use a target install generator.
          cmInstallTargetGeneratorLocal g(this, l->GetName(),
                                          destination.c_str(), false);
          g.Generate(os, config, configurationTypes);
        } break;
        case cmStateEnums::SHARED_LIBRARY: {
#if defined(_WIN32) || defined(__CYGWIN__)
          // Special code to handle DLL.  Install the import library
          // to the normal destination and the DLL to the runtime
          // destination.
          cmInstallTargetGeneratorLocal g1(this, l->GetName(),
                                           destination.c_str(), true);
          g1.Generate(os, config, configurationTypes);
          // We also skip over the leading slash given by the user.
          destination = l->Target->GetRuntimeInstallPath().substr(1);
          cmSystemTools::ConvertToUnixSlashes(destination);
          cmInstallTargetGeneratorLocal g2(this, l->GetName(),
                                           destination.c_str(), false);
          g2.Generate(os, config, configurationTypes);
#else
          // Use a target install generator.
          cmInstallTargetGeneratorLocal g(this, l->GetName(),
                                          destination.c_str(), false);
          g.Generate(os, config, configurationTypes);
#endif
        } break;
        default:
          break;
      }
    }

    // Include the user-specified post-install script for this target.
    if (const char* postinstall = l->GetProperty("POST_INSTALL_SCRIPT")) {
      cmInstallScriptGenerator g(postinstall, false, nullptr, false);
      g.Generate(os, config, configurationTypes);
    }
  }
}